

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

GlobalStateInfo
Fossilize::Hashing::parse_global_state_info
          (VkGraphicsPipelineCreateInfo *create_info,DynamicStateInfo *dynamic_info,
          SubpassMeta *meta)

{
  int iVar1;
  VkPipelineRasterizationStateCreateInfo *pVVar2;
  uint3 uVar3;
  uint uVar4;
  ulong uVar5;
  ulong in_RCX;
  ulong uVar6;
  uint3 uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong in_R8;
  ulong uVar12;
  VkBaseInStructure *base_in;
  int *piVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  GlobalStateInfo GVar20;
  
  piVar13 = (int *)create_info->pNext;
  uVar4 = 0xf;
  if (piVar13 != (int *)0x0) {
    do {
      if (*piVar13 == 0x3b9fac02) {
        if ((create_info->flags >> 0xb & 1) != 0) {
          uVar4 = piVar13[4];
        }
        break;
      }
      piVar13 = *(int **)(piVar13 + 2);
    } while (piVar13 != (int *)0x0);
  }
  pVVar2 = create_info->pRasterizationState;
  if ((((((ulong)meta & 1) == 0) && (pVVar2 != (VkPipelineRasterizationStateCreateInfo *)0x0)) &&
      ((uVar4 & 2) != 0)) && (pVVar2->rasterizerDiscardEnable == 1)) {
    uVar6 = 0;
    uVar12 = 0;
    uVar15 = 0;
    uVar14 = 0;
  }
  else {
    uVar6 = (in_RCX & 0xff) << 0x28;
    if (create_info->pColorBlendState == (VkPipelineColorBlendStateCreateInfo *)0x0) {
      uVar6 = 0;
    }
    uVar12 = (in_R8 & 0xff) << 0x20;
    if (create_info->pDepthStencilState == (VkPipelineDepthStencilStateCreateInfo *)0x0) {
      uVar12 = 0;
    }
    uVar15 = (ulong)(create_info->pMultisampleState != (VkPipelineMultisampleStateCreateInfo *)0x0)
             << 0x18;
    uVar14 = (ulong)(create_info->pViewportState != (VkPipelineViewportStateCreateInfo *)0x0) <<
             0x10;
  }
  bVar18 = create_info->pInputAssemblyState != (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  uVar16 = 0;
  uVar9 = (ulong)(byte)((byte)dynamic_info ^ 1);
  if (create_info->pVertexInputState == (VkPipelineVertexInputStateCreateInfo *)0x0) {
    uVar9 = uVar16;
  }
  bVar8 = (byte)uVar9;
  if ((uVar4 & 6) == 0) {
    uVar7 = 1;
  }
  else {
    uVar7 = 0x10101;
    if ((ulong)create_info->stageCount == 0) {
      uVar16 = 0;
    }
    else {
      lVar17 = 0;
      bVar19 = false;
      do {
        iVar1 = *(int *)((long)&create_info->pStages->stage + lVar17);
        if (iVar1 < 0x40) {
          if ((iVar1 == 2) || (iVar1 == 4)) {
            bVar19 = create_info->pTessellationState != (VkPipelineTessellationStateCreateInfo *)0x0
            ;
          }
        }
        else if ((iVar1 == 0x40) || (iVar1 == 0x80)) {
          uVar9 = 0;
          bVar18 = false;
        }
        bVar8 = (byte)uVar9;
        lVar17 = lVar17 + 0x30;
      } while ((ulong)create_info->stageCount * 0x30 != lVar17);
      uVar16 = (ulong)bVar19 << 8;
    }
  }
  uVar11 = uVar4 >> 1 & 1;
  uVar3 = uVar7 & 0x10100;
  if ((uVar4 & 0xe) != 0) {
    uVar3 = uVar7;
  }
  uVar9 = 0;
  if ((uVar4 & 8) == 0) {
    uVar6 = uVar9;
  }
  if ((uVar4 & 4) == 0) {
    uVar12 = uVar9;
  }
  if ((uVar4 & 0xc) == 0) {
    uVar15 = uVar9;
  }
  if (uVar11 == 0) {
    uVar16 = uVar9;
    uVar14 = uVar9;
  }
  bVar19 = (uVar4 & 1) == 0;
  uVar10 = (ulong)bVar8 << 0x30;
  if (bVar19) {
    uVar10 = uVar9;
  }
  uVar5 = (ulong)bVar18;
  if (bVar19) {
    uVar5 = uVar9;
  }
  GVar20._0_8_ = uVar5 | uVar16 |
                 uVar10 | uVar14 |
                 uVar12 | uVar6 | uVar15 |
                 (ulong)(pVVar2 != (VkPipelineRasterizationStateCreateInfo *)0x0 & (byte)uVar11) <<
                 0x38;
  GVar20.render_pass_state = (bool)(char)uVar3;
  GVar20.layout_state = (bool)(char)(uVar3 >> 8);
  GVar20.module_state = (bool)(char)(uVar3 >> 0x10);
  return GVar20;
}

Assistant:

static GlobalStateInfo parse_global_state_info(const VkGraphicsPipelineCreateInfo &create_info,
                                               const DynamicStateInfo &dynamic_info,
                                               const StateRecorder::SubpassMeta &meta)
{
	GlobalStateInfo info = {};

	info.rasterization_state = create_info.pRasterizationState != nullptr;
	info.render_pass_state = true;
	info.module_state = true;
	info.layout_state = true;

	auto state_flags = graphics_pipeline_get_effective_state_flags(create_info);

	info.rasterization_state = create_info.pRasterizationState &&
	                           (state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT) != 0;

	bool rasterizer_discard = !dynamic_info.rasterizer_discard_enable &&
	                          info.rasterization_state &&
	                          create_info.pRasterizationState->rasterizerDiscardEnable == VK_TRUE;

	if (!rasterizer_discard)
	{
		info.viewport_state = create_info.pViewportState != nullptr;
		info.multisample_state = create_info.pMultisampleState != nullptr;
		info.color_blend_state = create_info.pColorBlendState != nullptr && meta.uses_color;
		info.depth_stencil_state = create_info.pDepthStencilState != nullptr && meta.uses_depth_stencil;
	}

	info.input_assembly = create_info.pInputAssemblyState != nullptr;
	info.vertex_input = create_info.pVertexInputState != nullptr && !dynamic_info.vertex_input;

	info.module_state = graphics_pipeline_library_state_flags_have_module_state(state_flags);
	info.layout_state = info.module_state;

	if (info.module_state)
	{
		for (uint32_t i = 0; i < create_info.stageCount; i++)
		{
			switch (create_info.pStages[i].stage)
			{
			case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
			case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
				info.tessellation_state = create_info.pTessellationState != nullptr;
				break;

			case VK_SHADER_STAGE_MESH_BIT_EXT:
			case VK_SHADER_STAGE_TASK_BIT_EXT:
				info.input_assembly = false;
				info.vertex_input = false;
				break;

			default:
				break;
			}
		}
	}

	// If state is not part of the interface for a pipeline library, nop out that state explicitly.
	if ((state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_VERTEX_INPUT_INTERFACE_BIT_EXT) == 0)
	{
		info.input_assembly = false;
		info.vertex_input = false;
	}

	if ((state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT) == 0)
	{
		info.viewport_state = false;
		info.rasterization_state = false;
		info.tessellation_state = false;
	}

	if ((state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT) == 0)
	{
		info.depth_stencil_state = false;
	}

	if ((state_flags & (
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT)) == 0)
	{
		info.multisample_state = false;
	}

	if ((state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT) == 0)
		info.color_blend_state = false;

	// We can ignore formats for dynamic rendering if output interface isn't used, but that's too esoteric.
	// We're mostly interested in ignoring pointers which could be garbage.
	if ((state_flags & (
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT)) == 0)
	{
		info.render_pass_state = false;
	}

	return info;
}